

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.hh
# Opt level: O1

string * tinyusdz::removeSuffix(string *__return_storage_ptr__,string *str,string *suffix)

{
  pointer pcVar1;
  long lVar2;
  
  if ((suffix->_M_string_length <= str->_M_string_length) &&
     (lVar2 = ::std::__cxx11::string::find
                        ((char *)str,(ulong)(suffix->_M_dataplus)._M_p,
                         str->_M_string_length - suffix->_M_string_length), lVar2 != -1)) {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

inline std::string removeSuffix(const std::string &str,
                                const std::string &suffix) {
  if (endsWith(str, suffix)) {
    return str.substr(0, str.length() - suffix.length());
  }
  return str;
}